

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qsocks5socketengine.cpp
# Opt level: O2

bool __thiscall
QSocks5PasswordAuthenticator::beginAuthenticate
          (QSocks5PasswordAuthenticator *this,QTcpSocket *socket,bool *completed)

{
  char *pcVar1;
  char *pcVar2;
  long lVar3;
  undefined1 *puVar4;
  long in_FS_OFFSET;
  bool bVar5;
  QArrayDataPointer<char> local_98;
  QArrayDataPointer<char> local_78;
  QArrayDataPointer<char> local_58;
  long local_38;
  
  local_38 = *(long *)(in_FS_OFFSET + 0x28);
  *completed = false;
  local_58.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_58.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_58.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper((QString *)&local_58);
  local_78.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_78.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_78.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QString::toLatin1_helper((QString *)&local_78);
  local_98.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_98.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_98.ptr = &DAT_aaaaaaaaaaaaaaaa;
  QByteArray::QByteArray
            ((QByteArray *)&local_98,(longlong)((undefined1 *)(local_58.size + local_78.size) + 3),
             '\0');
  pcVar1 = QByteArray::data((QByteArray *)&local_98);
  *pcVar1 = '\x01';
  pcVar1[1] = (char)local_58.size;
  pcVar2 = QByteArray::data((QByteArray *)&local_58);
  memcpy(pcVar1 + 2,pcVar2,local_58.size);
  lVar3 = local_58.size << 0x20;
  pcVar1[lVar3 + 0x200000000 >> 0x20] = (char)local_78.size;
  pcVar2 = QByteArray::data((QByteArray *)&local_78);
  memcpy(pcVar1 + (lVar3 + 0x300000000 >> 0x20),pcVar2,local_78.size);
  puVar4 = (undefined1 *)QIODevice::write((QByteArray *)socket);
  bVar5 = puVar4 == (undefined1 *)local_98.size;
  QArrayDataPointer<char>::~QArrayDataPointer(&local_98);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_78);
  QArrayDataPointer<char>::~QArrayDataPointer(&local_58);
  if (*(long *)(in_FS_OFFSET + 0x28) == local_38) {
    return bVar5;
  }
  __stack_chk_fail();
}

Assistant:

bool QSocks5PasswordAuthenticator::beginAuthenticate(QTcpSocket *socket, bool *completed)
{
    *completed = false;
    QByteArray uname = userName.toLatin1();
    QByteArray passwd = password.toLatin1();
    QByteArray dataBuf(3 + uname.size() + passwd.size(), 0);
    char *buf = dataBuf.data();
    int pos = 0;
    buf[pos++] = S5_PASSWORDAUTH_VERSION;
    buf[pos++] = uname.size();
    memcpy(&buf[pos], uname.data(), uname.size());
    pos += uname.size();
    buf[pos++] = passwd.size();
    memcpy(&buf[pos], passwd.data(), passwd.size());
    return socket->write(dataBuf) == dataBuf.size();
}